

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O1

void PrintOutput(N_Vector cB,int ns,int mxns,WebData wdata)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  undefined4 in_register_00000014;
  double *pdVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  double *pdVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar5 = CONCAT44(in_register_00000034,ns);
  lVar1 = N_VGetArrayPointer(cB,lVar5,CONCAT44(in_register_00000014,mxns));
  pdVar7 = (double *)(lVar1 + 0x4740);
  dVar9 = 0.0;
  dVar10 = 0.0;
  lVar1 = 1;
  do {
    dVar11 = 0.0;
    lVar2 = 0x13;
    pdVar3 = pdVar7;
    do {
      lVar6 = 0;
      pdVar4 = pdVar3;
      do {
        if (dVar11 < ABS(*pdVar4)) {
          dVar9 = *(double *)(lVar5 + 0x310) * (double)(int)lVar6;
          dVar10 = *(double *)(lVar5 + 0x318) * (double)(int)lVar2;
          dVar11 = *pdVar4;
        }
        lVar6 = lVar6 + 1;
        pdVar4 = pdVar4 + 6;
      } while (lVar6 != 0x14);
      pdVar3 = pdVar3 + -0x78;
      bVar8 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar8);
    printf("\nMaximum sensitivity with respect to I.C. of species %d\n");
    printf("  mu max = %e\n",dVar11);
    puts("at");
    printf("  x = %e\n  y = %e\n",dVar9,dVar10);
    lVar1 = lVar1 + 1;
    pdVar7 = pdVar7 + 1;
  } while (lVar1 != 7);
  return;
}

Assistant:

static void PrintOutput(N_Vector cB, int ns, int mxns, WebData wdata)
{
  int i, jx, jy;
  sunrealtype *cdata, cij, cmax, x, y;

  x = y = ZERO;

  cdata = N_VGetArrayPointer(cB);

  for (i = 1; i <= ns; i++)
  {
    cmax = ZERO;

    for (jy = MY - 1; jy >= 0; jy--)
    {
      for (jx = 0; jx < MX; jx++)
      {
        cij = cdata[(i - 1) + jx * ns + jy * mxns];
        if (SUNRabs(cij) > cmax)
        {
          cmax = cij;
          x    = jx * wdata->dx;
          y    = jy * wdata->dy;
        }
      }
    }

    printf("\nMaximum sensitivity with respect to I.C. of species %d\n", i);
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("  mu max = %Le\n", cmax);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("  mu max = %e\n", cmax);
#else
    printf("  mu max = %e\n", cmax);
#endif
    printf("at\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("  x = %Le\n  y = %Le\n", x, y);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("  x = %e\n  y = %e\n", x, y);
#else
    printf("  x = %e\n  y = %e\n", x, y);
#endif
  }
}